

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

bool __thiscall olc::ResourcePack::SavePack(ResourcePack *this,string *sFile,string *sKey)

{
  _Base_ptr size;
  char cVar1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  ResourcePack *this_00;
  uint32_t uVar4;
  _Rb_tree_header *p_Var5;
  uint32_t nIndexStringLen;
  vector<char,_std::allocator<char>_> sIndexString;
  uint32_t nMapSize;
  uint32_t nIndexSize;
  ResourcePack *local_450;
  string *local_448;
  anon_class_8_1_6bf940be write;
  ofstream ofs;
  vector<char,_std::allocator<char>_> stream;
  
  std::ofstream::ofstream(&ofs,(string *)sFile,_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    nIndexSize = 0;
    std::ostream::write((char *)&ofs,(long)&nIndexSize);
    nMapSize = (uint32_t)(this->mapFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_448 = sKey;
    std::ostream::write((char *)&ofs,(long)&nMapSize);
    p_Var5 = &(this->mapFiles)._M_t._M_impl.super__Rb_tree_header;
    local_450 = this;
    for (p_Var2 = (this->mapFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != p_Var5; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      stream.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)p_Var2[1]._M_parent;
      std::ostream::write((char *)&ofs,(long)&stream);
      std::ostream::write((char *)&ofs,*(long *)(p_Var2 + 1));
      std::ostream::write((char *)&ofs,(long)(p_Var2 + 2));
      std::ostream::write((char *)&ofs,(long)&p_Var2[2].field_0x4);
    }
    nIndexSize = std::ostream::tellp();
    uVar4 = nIndexSize;
    for (p_Var3 = (local_450->mapFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != p_Var5;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      *(uint32_t *)&p_Var3[2].field_0x4 = uVar4;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sIndexString,
                 (ulong)p_Var3[2]._M_color,(allocator_type *)&stream);
      std::ifstream::ifstream((allocator_type *)&stream,(string *)(p_Var3 + 1),_S_bin);
      std::istream::read((char *)&stream,
                         (long)sIndexString.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start);
      std::ifstream::close();
      std::ostream::write((char *)&ofs,
                          (long)sIndexString.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                .super__Vector_impl_data._M_start);
      uVar4 = uVar4 + p_Var3[2]._M_color;
      std::ifstream::~ifstream((allocator_type *)&stream);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sIndexString);
    }
    stream.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    stream.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    stream.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    this_00 = (ResourcePack *)&nMapSize;
    write.stream = &stream;
    SavePack::anon_class_8_1_6bf940be::operator()(&write,(char *)this_00,4);
    for (p_Var2 = (local_450->mapFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != p_Var5; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      size = p_Var2[1]._M_parent;
      sIndexString.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)size;
      SavePack::anon_class_8_1_6bf940be::operator()(&write,(char *)&sIndexString,4);
      SavePack::anon_class_8_1_6bf940be::operator()(&write,*(char **)(p_Var2 + 1),(size_t)size);
      SavePack::anon_class_8_1_6bf940be::operator()(&write,(char *)(p_Var2 + 2),4);
      this_00 = (ResourcePack *)&p_Var2[2].field_0x4;
      SavePack::anon_class_8_1_6bf940be::operator()(&write,(char *)this_00,4);
    }
    scramble(&sIndexString,this_00,&stream,local_448);
    nIndexStringLen =
         (int)sIndexString.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish -
         (int)sIndexString.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
    std::ostream::seekp((long)&ofs,_S_beg);
    std::ostream::write((char *)&ofs,(long)&nIndexStringLen);
    std::ostream::write((char *)&ofs,
                        (long)sIndexString.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
    std::ofstream::close();
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&sIndexString.super__Vector_base<char,_std::allocator<char>_>);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&stream.super__Vector_base<char,_std::allocator<char>_>);
  }
  std::ofstream::~ofstream(&ofs);
  return (bool)cVar1;
}

Assistant:

bool ResourcePack::SavePack(const std::string& sFile, const std::string& sKey)
	{
		// Create/Overwrite the resource file
		std::ofstream ofs(sFile, std::ofstream::binary);
		if (!ofs.is_open()) return false;

		// Iterate through map
		uint32_t nIndexSize = 0; // Unknown for now
		ofs.write((char*)&nIndexSize, sizeof(uint32_t));
		uint32_t nMapSize = uint32_t(mapFiles.size());
		ofs.write((char*)&nMapSize, sizeof(uint32_t));
		for (auto& e : mapFiles)
		{
			// Write the path of the file
			size_t nPathSize = e.first.size();
			ofs.write((char*)&nPathSize, sizeof(uint32_t));
			ofs.write(e.first.c_str(), nPathSize);

			// Write the file entry properties
			ofs.write((char*)&e.second.nSize, sizeof(uint32_t));
			ofs.write((char*)&e.second.nOffset, sizeof(uint32_t));
		}

		// 2) Write the individual Data
		std::streampos offset = ofs.tellp();
		nIndexSize = (uint32_t)offset;
		for (auto& e : mapFiles)
		{
			// Store beginning of file offset within resource pack file
			e.second.nOffset = (uint32_t)offset;

			// Load the file to be added
			std::vector<uint8_t> vBuffer(e.second.nSize);
			std::ifstream i(e.first, std::ifstream::binary);
			i.read((char*)vBuffer.data(), e.second.nSize);
			i.close();

			// Write the loaded file into resource pack file
			ofs.write((char*)vBuffer.data(), e.second.nSize);
			offset += e.second.nSize;
		}

		// 3) Scramble Index
		std::vector<char> stream;
		auto write = [&stream](const char* data, size_t size) {
			size_t sizeNow = stream.size();
			stream.resize(sizeNow + size);
			memcpy(stream.data() + sizeNow, data, size);
		};

		// Iterate through map
		write((char*)&nMapSize, sizeof(uint32_t));
		for (auto& e : mapFiles)
		{
			// Write the path of the file
			size_t nPathSize = e.first.size();
			write((char*)&nPathSize, sizeof(uint32_t));
			write(e.first.c_str(), nPathSize);

			// Write the file entry properties
			write((char*)&e.second.nSize, sizeof(uint32_t));
			write((char*)&e.second.nOffset, sizeof(uint32_t));
		}
		std::vector<char> sIndexString = scramble(stream, sKey);
		uint32_t nIndexStringLen = uint32_t(sIndexString.size());
		// 4) Rewrite Map (it has been updated with offsets now)
		// at start of file
		ofs.seekp(0, std::ios::beg);
		ofs.write((char*)&nIndexStringLen, sizeof(uint32_t));
		ofs.write(sIndexString.data(), nIndexStringLen);
		ofs.close();
		return true;
	}